

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void BailOutRecord::CheckPreemptiveRejit
               (FunctionBody *executeFunction,BailOutKind bailOutKind,BailOutRecord *bailoutRecord,
               uint8 *callsOrIterationsCount,int loopNumber)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  int loopNumber_local;
  uint8 *callsOrIterationsCount_local;
  BailOutRecord *bailoutRecord_local;
  BailOutKind bailOutKind_local;
  FunctionBody *executeFunction_local;
  
  if ((bailOutKind == BailOutOnNoProfile) &&
     (bVar1 = Js::FunctionBody::IncrementBailOnMisingProfileCount(executeFunction),
     DAT_01e9e258 < (int)(uint)bVar1)) {
    Js::FunctionBody::ResetBailOnMisingProfileCount(executeFunction);
    bailoutRecord->bailOutCount = 0;
    *callsOrIterationsCount = '\0';
  }
  else if (((int)DAT_01ebb8a8 < (int)(uint)bailoutRecord->bailOutCount) &&
          ((((bailOutKind == BailOutOnInlineFunction ||
             (bailOutKind - BailOutOnPolymorphicInlineFunction < 2)) ||
            (bailOutKind - BailOutFailedTypeCheck < 2)) ||
           ((bailOutKind - BailOutFailedInlineTypeCheck < 4 ||
            (bailOutKind == BailOutFailedCtorGuardCheck)))))) {
    if (loopNumber == -1) {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ReJITPhase);
      if ((bVar2) &&
         ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca300), bVar2 ||
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca300,bailOutKind), bVar2)))) {
        iVar3 = (*(executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar4 = GetBailOutKindName(bailOutKind);
        Output::Print(L"Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"
                      ,CONCAT44(extraout_var,iVar3),pcVar4,(ulong)bailoutRecord->bailOutCount,
                      (ulong)*callsOrIterationsCount,(ulong)DAT_01ebb8a8);
        Output::Flush();
      }
    }
    else {
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ReJITPhase);
      if ((bVar2) &&
         ((bVar2 = Js::NumberSet::Empty((NumberSet *)&DAT_01eca300), bVar2 ||
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_01eca300,bailOutKind), bVar2)))) {
        iVar3 = (*(executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar4 = GetBailOutKindName(bailOutKind);
        Output::Print(L"Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, loopNumber: %d, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"
                      ,CONCAT44(extraout_var_00,iVar3),(ulong)(uint)loopNumber,pcVar4,
                      (ulong)bailoutRecord->bailOutCount,(ulong)*callsOrIterationsCount,DAT_01ebb8a8
                     );
        Output::Flush();
      }
    }
    bailoutRecord->bailOutCount = 0;
    *callsOrIterationsCount = '\0';
  }
  return;
}

Assistant:

void BailOutRecord::CheckPreemptiveRejit(Js::FunctionBody* executeFunction, IR::BailOutKind bailOutKind, BailOutRecord* bailoutRecord, uint8& callsOrIterationsCount, int loopNumber)
{
    if (bailOutKind == IR::BailOutOnNoProfile && executeFunction->IncrementBailOnMisingProfileCount() > CONFIG_FLAG(BailOnNoProfileLimit))
    {
        // A rejit here should improve code quality, so lets avoid too many unnecessary bailouts.
        executeFunction->ResetBailOnMisingProfileCount();
        bailoutRecord->bailOutCount = 0;
        callsOrIterationsCount = 0;
    }
    else if (bailoutRecord->bailOutCount > CONFIG_FLAG(RejitMaxBailOutCount))
    {
        switch (bailOutKind)
        {
        case IR::BailOutOnPolymorphicInlineFunction:
        case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
        case IR::BailOutFailedInlineTypeCheck:
        case IR::BailOutOnInlineFunction:
        case IR::BailOutFailedTypeCheck:
        case IR::BailOutFailedFixedFieldTypeCheck:
        case IR::BailOutFailedCtorGuardCheck:
        case IR::BailOutFailedFixedFieldCheck:
        case IR::BailOutFailedEquivalentTypeCheck:
        case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
        {
            // If we consistently see RejitMaxBailOutCount bailouts for these kinds, then likely we have stale profile data and it is beneficial to rejit.
            // Note you need to include only bailout kinds which don't disable the entire optimizations.
            if (loopNumber == -1)
            {
                REJIT_KIND_TESTTRACE(bailOutKind, _u("Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"),
                    executeFunction->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailoutRecord->bailOutCount, callsOrIterationsCount, CONFIG_FLAG(RejitMaxBailOutCount));
            }
            else
            {
                REJIT_KIND_TESTTRACE(bailOutKind, _u("Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, loopNumber: %d, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"),
                    executeFunction->GetDisplayName(), loopNumber, ::GetBailOutKindName(bailOutKind), bailoutRecord->bailOutCount, callsOrIterationsCount, CONFIG_FLAG(RejitMaxBailOutCount));
            }
            bailoutRecord->bailOutCount = 0;
            callsOrIterationsCount = 0;
            break;
        }
        default: break;
        }
    }
}